

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O0

int redefine_key(int f,int n)

{
  char *pcVar1;
  KEYMAP *curmap;
  ulong uVar2;
  KEYMAP *mp;
  char *bufp;
  char tmp [32];
  int n_local;
  int f_local;
  
  tmp._28_4_ = n;
  strlcpy(redefine_key::buf,"Define key map: ",0x30);
  pcVar1 = eread("%s",(char *)&bufp,0x20,8,redefine_key::buf);
  if (pcVar1 == (char *)0x0) {
    n_local = 2;
  }
  else if (*pcVar1 == '\0') {
    n_local = 0;
  }
  else {
    strlcat(redefine_key::buf,&bufp,0x30);
    curmap = name_map((char *)&bufp);
    if (curmap == (KEYMAP *)0x0) {
      n_local = dobeep_msgs("Unknown map",(char *)&bufp);
    }
    else {
      uVar2 = strlcat(redefine_key::buf,"key: ",0x30);
      if (uVar2 < 0x30) {
        n_local = dobind(curmap,redefine_key::buf,0);
      }
      else {
        n_local = 0;
      }
    }
  }
  return n_local;
}

Assistant:

int
redefine_key(int f, int n)
{
	static char	 buf[48];
	char		 tmp[32], *bufp;
	KEYMAP		*mp;

	(void)strlcpy(buf, "Define key map: ", sizeof(buf));
	if ((bufp = eread("%s", tmp, sizeof(tmp), EFNEW, buf)) == NULL)
		return (ABORT);
	else if (bufp[0] == '\0')
		return (FALSE);
	(void)strlcat(buf, tmp, sizeof(buf));
	if ((mp = name_map(tmp)) == NULL)
		return (dobeep_msgs("Unknown map", tmp));

	if (strlcat(buf, "key: ", sizeof(buf)) >= sizeof(buf))
		return (FALSE);

	return (dobind(mp, buf, FALSE));
}